

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_double<long_double,fmt::FormatSpec>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  CharTraits<char> CVar1;
  Alignment AVar2;
  wchar_t wVar3;
  bool bVar4;
  unkbyte10 Var5;
  CharTraits<char> CVar6;
  uint uVar7;
  CharTraits<char> *pCVar8;
  Buffer<char> *pBVar9;
  undefined2 *puVar10;
  Buffer<char> *pBVar11;
  uint uVar12;
  char *pcVar13;
  CharTraits<char> CVar14;
  size_t __len_1;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  int in_R9D;
  size_t __len;
  ulong __n;
  Buffer<char> **ppBVar18;
  ulong __n_00;
  byte bVar19;
  bool bVar20;
  char format [10];
  char in_stack_ffffffffffffff7f;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  uint local_70;
  longdouble local_5c;
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 local_4f [7];
  undefined1 local_48 [24];
  
  bVar19 = spec->type_;
  uVar12 = bVar19 - 0x41;
  if (uVar12 < 0x27) {
    if ((0x71UL >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar12 & 0x3f) & 1) == 0) goto LAB_001259fb;
      goto LAB_001257a7;
    }
    bVar4 = true;
  }
  else {
LAB_001259fb:
    if (bVar19 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff7f,
                 (char *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
    }
    bVar19 = 0x67;
LAB_001257a7:
    bVar4 = false;
  }
  local_48._0_10_ = value;
  Var5 = local_48._0_10_;
  local_48._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  local_48._0_10_ = Var5;
  if ((short)local_48._8_2_ < 0) {
    local_5c = -value;
    if (NAN(value)) {
      CVar14 = (CharTraits<char>)0x2d;
      goto LAB_00125b64;
    }
    CVar14 = (CharTraits<char>)0x2d;
    if (value <= (longdouble)-INFINITY) goto LAB_00125849;
    pBVar9 = this->buffer_;
    sVar15 = pBVar9->size_;
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    CVar14 = (CharTraits<char>)0x2d;
LAB_001258c5:
    if (pBVar9->capacity_ < (uVar12 + (uVar12 == 0)) + sVar15) {
      (**pBVar9->_vptr_Buffer)(pBVar9);
    }
    bVar20 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    bVar4 = false;
    if (bVar20) {
      uVar12 = 0;
    }
    sVar15 = sVar15 + 1;
    uVar7 = spec->flags_;
  }
  else {
    uVar7 = spec->flags_;
    CVar14 = (CharTraits<char>)0x2b;
    if ((uVar7 & 2) == 0) {
      CVar14 = (CharTraits<char>)0x20;
    }
    if (NAN(value)) {
      if ((uVar7 & 1) == 0) {
        pcVar13 = " NAN";
        pcVar16 = " nan";
LAB_00125805:
        if (bVar4) {
          pcVar16 = pcVar13;
        }
        write_str<char>(this,pcVar16 + 1,3,&spec->super_AlignSpec);
        return;
      }
LAB_00125b64:
      pcVar13 = " NAN";
      pcVar16 = " nan";
LAB_00125857:
      if (bVar4) {
        pcVar16 = pcVar13;
      }
      pCVar8 = (CharTraits<char> *)write_str<char>(this,pcVar16,4,&spec->super_AlignSpec);
      *pCVar8 = CVar14;
      return;
    }
    if ((longdouble)INFINITY <= value) {
      if ((uVar7 & 1) == 0) {
        pcVar13 = " INF";
        pcVar16 = " inf";
        goto LAB_00125805;
      }
LAB_00125849:
      pcVar13 = " INF";
      pcVar16 = " inf";
      goto LAB_00125857;
    }
    pBVar9 = this->buffer_;
    sVar15 = pBVar9->size_;
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if ((uVar7 & 1) != 0) {
      local_5c = value;
      goto LAB_001258c5;
    }
    CVar14 = (CharTraits<char>)0x0;
    bVar4 = true;
    local_5c = value;
  }
  ppBVar18 = &this->buffer_;
  local_52 = 0x25;
  if ((uVar7 & 8) == 0) {
    puVar10 = (undefined2 *)local_51;
  }
  else {
    puVar10 = (undefined2 *)(local_51 + 1);
    local_51[0] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_00125937:
    uVar12 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *(undefined1 *)puVar10 = 0x2d;
      puVar10 = (undefined2 *)((long)puVar10 + 1);
    }
    if (uVar12 == 0) goto LAB_00125937;
    *(undefined1 *)puVar10 = 0x2a;
    puVar10 = (undefined2 *)((long)puVar10 + 1);
  }
  if (-1 < spec->precision_) {
    *puVar10 = 0x2a2e;
    puVar10 = puVar10 + 1;
  }
  *(undefined1 *)puVar10 = 0x4c;
  *(byte *)((long)puVar10 + 1) = bVar19;
  *(undefined1 *)(puVar10 + 1) = 0;
  wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
LAB_00125969:
  while( true ) {
    pCVar8 = (CharTraits<char> *)((*ppBVar18)->ptr_ + sVar15);
    uVar7 = internal::CharTraits<char>::format_float<long_double>
                      (pCVar8,(char *)((*ppBVar18)->capacity_ - sVar15),(size_t)&local_52,
                       (char *)(ulong)uVar12,spec->precision_,in_R9D,local_5c);
    if ((int)uVar7 < 0) goto LAB_001259bb;
    pBVar9 = *ppBVar18;
    if (uVar7 + sVar15 < pBVar9->capacity_) break;
    uVar17 = uVar7 + sVar15 + 1;
    if (pBVar9->capacity_ < uVar17) goto LAB_001259cc;
  }
  if (bVar4) {
    CVar14 = (CharTraits<char>)0x0;
    goto LAB_00125a2a;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    CVar1 = *pCVar8;
joined_r0x00125a1b:
    CVar6 = SUB41(wVar3,0);
    if (CVar1 != (CharTraits<char>)0x20) goto LAB_00125a1f;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      CVar1 = *pCVar8;
      goto joined_r0x00125a1b;
    }
LAB_00125a1f:
    CVar6 = CVar14;
    CVar14 = (CharTraits<char>)0x0;
  }
  pCVar8[-1] = CVar6;
  uVar7 = uVar7 + 1;
LAB_00125a2a:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar7 < uVar12) {
      pBVar9 = *ppBVar18;
      sVar15 = pBVar9->size_;
      uVar17 = sVar15 + uVar12;
      pBVar11 = pBVar9;
      if (pBVar9->capacity_ < uVar17) {
        (**pBVar9->_vptr_Buffer)(pBVar9,uVar17);
        pBVar11 = *ppBVar18;
      }
      pBVar9->size_ = uVar17;
      pcVar16 = pBVar11->ptr_ + sVar15;
      __n_00 = (ulong)uVar7;
      memmove(pcVar16 + (uVar12 - uVar7 >> 1),pcVar16,__n_00);
      uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar17 = uVar12 - __n_00;
      __n = uVar17 >> 1;
      if (1 < uVar17) {
        local_70 = wVar3 & 0xff;
        memset(pcVar16,local_70,__n);
      }
      if (uVar12 == uVar7) {
        return;
      }
      memset(pcVar16 + __n_00 + __n,wVar3 & 0xff,uVar17 - __n);
      return;
    }
  }
  if ((CVar14 != (CharTraits<char>)0x0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' '))
  {
    CVar1 = *pCVar8;
    while (CVar1 == (CharTraits<char>)0x20) {
      *pCVar8 = SUB41(wVar3,0);
      CVar1 = pCVar8[1];
      pCVar8 = pCVar8 + 1;
    }
    if (CVar14 != (CharTraits<char>)0x0) {
      pCVar8[-1] = CVar14;
    }
  }
  pBVar9 = *ppBVar18;
  uVar17 = (ulong)uVar7 + pBVar9->size_;
  if (pBVar9->capacity_ < uVar17) {
    (**pBVar9->_vptr_Buffer)(pBVar9,uVar17);
  }
  pBVar9->size_ = uVar17;
  return;
LAB_001259bb:
  pBVar9 = *ppBVar18;
  if (pBVar9->capacity_ != 0xffffffffffffffff) {
    uVar17 = pBVar9->capacity_ + 1;
LAB_001259cc:
    (**pBVar9->_vptr_Buffer)(pBVar9,uVar17);
  }
  goto LAB_00125969;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const Spec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}